

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::TrackTempObjectSyms(GlobOpt *this,Instr *instr,RegOpnd *opnd)

{
  ushort uVar1;
  BVIndex i;
  BasicBlock *pBVar2;
  Opnd *pOVar3;
  Type pJVar4;
  IntConstOpnd *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  bool bVar8;
  bool bVar9;
  OpndKind OVar10;
  uint32 offset;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  StackSym *this_02;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  JITTimeFunctionBody *this_03;
  PropertyIdArray *pPVar14;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar15;
  char cVar16;
  undefined1 local_60 [8];
  StackLiteralInitFldData data;
  StackSym *sym;
  
  if (((instr->field_0x36 & 8) != 0) &&
     (bVar6 = ObjectTempVerify::CanMarkTemp(instr,(BackwardPass *)0x0), !bVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41b4,
                       "(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr))",
                       "!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr)");
    if (!bVar6) goto LAB_0046b261;
    *puVar11 = 0;
  }
  pBVar2 = this->currentBlock;
  bVar6 = OpCodeAttr::TempObjectProducing(instr->m_opcode);
  if (bVar6) {
    uVar1 = *(ushort *)&instr->field_0x36;
    if ((uVar1 & 8) == 0) {
      bVar6 = false;
    }
    else {
      bVar6 = ObjectTemp::CanStoreTemp(instr);
    }
    cVar16 = (char)((uVar1 & 8) >> 3);
  }
  else {
    bVar6 = OpCodeAttr::TempObjectTransfer(instr->m_opcode);
    if (bVar6) {
      if ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_0046abb7:
        bVar9 = false;
      }
      else {
        OVar10 = IR::Opnd::GetKind(instr->m_src1);
        if (OVar10 == OpndKindReg) {
          pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
          pOVar3 = instr->m_src1;
          OVar10 = IR::Opnd::GetKind(pOVar3);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_0046b261;
            *puVar11 = 0;
          }
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar13,*(BVIndex *)(pOVar3[1]._vptr_Opnd + 2));
          bVar9 = true;
          if (BVar7 == '\0') goto LAB_0046aae8;
        }
        else {
LAB_0046aae8:
          if ((instr->m_src2 == (Opnd *)0x0) ||
             (OVar10 = IR::Opnd::GetKind(instr->m_src2), OVar10 != OpndKindReg)) goto LAB_0046abb7;
          pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
          pOVar3 = instr->m_src2;
          OVar10 = IR::Opnd::GetKind(pOVar3);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_0046b261;
            *puVar11 = 0;
          }
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar13,*(BVIndex *)(pOVar3[1]._vptr_Opnd + 2));
          bVar9 = BVar7 != '\0';
        }
      }
      if (((pBVar2->globOptData).canStoreTempObjectSyms ==
           (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
         (OVar10 = IR::Opnd::GetKind(instr->m_src1), OVar10 != OpndKindReg)) {
LAB_0046ad25:
        bVar6 = false;
      }
      else {
        pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
        pOVar3 = instr->m_src1;
        OVar10 = IR::Opnd::GetKind(pOVar3);
        if (OVar10 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar6) goto LAB_0046b261;
          *puVar11 = 0;
        }
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pBVar13,*(BVIndex *)(pOVar3[1]._vptr_Opnd + 2));
        if (BVar7 == '\0') goto LAB_0046ad25;
        if (instr->m_src2 != (Opnd *)0x0) {
          OVar10 = IR::Opnd::GetKind(instr->m_src2);
          if (OVar10 == OpndKindReg) {
            pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
            pRVar12 = IR::Opnd::AsRegOpnd(instr->m_src2);
            BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                              (pBVar13,(pRVar12->m_sym->super_Sym).m_id);
            if (BVar7 != '\0') goto LAB_0046acb5;
          }
          goto LAB_0046ad25;
        }
LAB_0046acb5:
        bVar6 = true;
        if ((instr->field_0x36 & 8) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x41cd,"(!canStoreTemp || instr->dstIsTempObject)",
                             "!canStoreTemp || instr->dstIsTempObject");
          if (!bVar8) goto LAB_0046b261;
          *puVar11 = 0;
        }
      }
      if (bVar9) {
        cVar16 = '\x01';
        if ((instr->field_0x36 & 8) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x41ce,"(!maybeTemp || instr->dstIsTempObject)",
                             "!maybeTemp || instr->dstIsTempObject");
          if (!bVar9) goto LAB_0046b261;
          *puVar11 = 0;
        }
      }
      else {
        cVar16 = '\0';
      }
    }
    else {
      cVar16 = '\0';
      bVar6 = false;
    }
  }
  this_02 = opnd->m_sym;
  if ((this_02->m_type != TyVar) &&
     (data._8_8_ = this_02, this_02 = StackSym::GetVarEquivSym(this_02,(Func *)0x0),
     this_02 == (StackSym *)0x0)) {
    return;
  }
  i = (this_02->super_Sym).m_id;
  data._8_8_ = this_02;
  if (cVar16 == '\0') {
    if (bVar6 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4213,"(!canStoreTemp)","!canStoreTemp");
      if (!bVar6) goto LAB_0046b261;
      *puVar11 = 0;
    }
    pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
    this_01 = (pBVar2->globOptData).canStoreTempObjectSyms;
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (this_01 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x421e,"(!globOptData.canStoreTempObjectSyms)",
                           "!globOptData.canStoreTempObjectSyms");
        if (!bVar6) goto LAB_0046b261;
        *puVar11 = 0;
      }
    }
    else {
      if (this_01 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::Clear(this_01,i);
        pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(pBVar13,i);
    }
    if ((((this->prePassLoop == (Loop *)0x0) &&
         (pBVar15 = (pBVar2->globOptData).stackLiteralInitFldDataMap,
         pBVar15 !=
         (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)0x0)) && (pBVar15->count != pBVar15->freeCount)) &&
       (bVar6 = JsUtil::
                BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(pBVar15,(StackSym **)&data.currentInitFldCount), bVar6)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4225,
                         "(this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))"
                         ,
                         "this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)"
                        );
      if (!bVar6) goto LAB_0046b261;
      *puVar11 = 0;
    }
  }
  else {
    if (opnd->m_sym != this_02) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x41e0,"(opnd->m_sym == sym)","opnd->m_sym == sym");
      if (!bVar9) goto LAB_0046b261;
      *puVar11 = 0;
    }
    pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
      pJVar4 = this->alloc;
      pBVar13->head = (Type_conflict)0x0;
      pBVar13->lastFoundIndex = (Type_conflict)0x0;
      pBVar13->alloc = pJVar4;
      pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
      (pBVar2->globOptData).maybeTempObjectSyms = pBVar13;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(pBVar13,i);
    if (bVar6 == false) {
      pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
      if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(pBVar13,i);
      return;
    }
    if ((instr->m_opcode == NewScObjectLiteral) && (this->prePassLoop == (Loop *)0x0)) {
      this_00 = (IntConstOpnd *)instr->m_src1;
      OVar10 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar10 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_0046b261;
        *puVar11 = 0;
      }
      this_03 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      offset = IR::IntConstOpnd::AsUint32(this_00);
      pPVar14 = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(this_03,offset);
      if (pPVar14->hadDuplicates == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x41f8,"(!propIds->hadDuplicates)","!propIds->hadDuplicates");
        if (!bVar6) goto LAB_0046b261;
        *puVar11 = 0;
      }
      pBVar15 = (pBVar2->globOptData).stackLiteralInitFldDataMap;
      if (pBVar15 ==
          (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        pBVar15 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::JitArenaAllocator>(0x38,this->alloc,0x3eba5c);
        JsUtil::
        BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::BaseDictionary(pBVar15,this->alloc,0);
        (pBVar2->globOptData).stackLiteralInitFldDataMap = pBVar15;
      }
      else {
        bVar6 = JsUtil::
                BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(pBVar15,(StackSym **)&data.currentInitFldCount);
        if (bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x4200,"(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))",
                             "!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)");
          if (!bVar6) {
LAB_0046b261:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
        }
      }
      data.propIds._0_4_ = 0;
      local_60 = (undefined1  [8])pPVar14;
      JsUtil::
      BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)(pBVar2->globOptData).stackLiteralInitFldDataMap,
                 (StackSym **)&data.currentInitFldCount,(StackLiteralInitFldData *)local_60);
    }
    pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
      pJVar4 = this->alloc;
      pBVar13->head = (Type_conflict)0x0;
      pBVar13->lastFoundIndex = (Type_conflict)0x0;
      pBVar13->alloc = pJVar4;
      pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
      (pBVar2->globOptData).canStoreTempObjectSyms = pBVar13;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(pBVar13,i);
  }
  return;
}

Assistant:

void
GlobOpt::TrackTempObjectSyms(IR::Instr * instr, IR::RegOpnd * opnd)
{
    // If it is marked as dstIsTempObject, we should have mark temped it, or type specialized it to Ld_I4.
    Assert(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr));
    GlobOptBlockData& globOptData = *CurrentBlockData();
    bool canStoreTemp = false;
    bool maybeTemp = false;
    if (OpCodeAttr::TempObjectProducing(instr->m_opcode))
    {
        maybeTemp = instr->dstIsTempObject;

        // We have to make sure that lower will always generate code to do stack allocation
        // before we can store any other stack instance onto it. Otherwise, we would not
        // walk object to box the stack property.
        canStoreTemp = instr->dstIsTempObject && ObjectTemp::CanStoreTemp(instr);
    }
    else if (OpCodeAttr::TempObjectTransfer(instr->m_opcode))
    {
        // Need to check both sources, GetNewScObject has two srcs for transfer.
        // No need to get var equiv sym here as transfer of type spec value does not transfer a mark temp object.
        maybeTemp = globOptData.maybeTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            || (instr->GetSrc2() && instr->GetSrc2()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id)));

        canStoreTemp = globOptData.canStoreTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            && (!instr->GetSrc2() || (instr->GetSrc2()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id))));

        AssertOrFailFast(!canStoreTemp || instr->dstIsTempObject);
        AssertOrFailFast(!maybeTemp || instr->dstIsTempObject);
    }

    // Need to get the var equiv sym as assignment of type specialized sym kill the var sym value anyway.
    StackSym * sym = opnd->m_sym;
    if (!sym->IsVar())
    {
        sym = sym->GetVarEquivSym(nullptr);
        if (sym == nullptr)
        {
            return;
        }
    }

    SymID symId = sym->m_id;
    if (maybeTemp)
    {
        // Only var sym should be temp objects
        Assert(opnd->m_sym == sym);

        if (globOptData.maybeTempObjectSyms == nullptr)
        {
            globOptData.maybeTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
        }
        globOptData.maybeTempObjectSyms->Set(symId);

        if (canStoreTemp)
        {
            if (instr->m_opcode == Js::OpCode::NewScObjectLiteral && !this->IsLoopPrePass())
            {
                // For object literal, we install the final type up front.
                // If there are bailout before we finish initializing all the fields, we need to
                // zero out the rest if we stack allocate the literal, so that the boxing would not
                // try to box trash pointer in the properties.

                // Although object Literal initialization can be done lexically, BailOnNoProfile may cause some path
                // to disappear. Do it is flow base make it easier to stop propagate those entries.

                IR::IntConstOpnd * propertyArrayIdOpnd = instr->GetSrc1()->AsIntConstOpnd();
                const Js::PropertyIdArray * propIds = instr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());

                // Duplicates are removed by parser
                Assert(!propIds->hadDuplicates);

                if (globOptData.stackLiteralInitFldDataMap == nullptr)
                {
                    globOptData.stackLiteralInitFldDataMap = JitAnew(alloc, StackLiteralInitFldDataMap, alloc);
                }
                else
                {
                    Assert(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
                }
                StackLiteralInitFldData data = { propIds, 0};
                globOptData.stackLiteralInitFldDataMap->AddNew(sym, data);
            }

            if (globOptData.canStoreTempObjectSyms == nullptr)
            {
                globOptData.canStoreTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
            }
            globOptData.canStoreTempObjectSyms->Set(symId);
        }
        else if (globOptData.canStoreTempObjectSyms)
        {
            globOptData.canStoreTempObjectSyms->Clear(symId);
        }
    }
    else
    {
        Assert(!canStoreTemp);
        if (globOptData.maybeTempObjectSyms)
        {
            if (globOptData.canStoreTempObjectSyms)
            {
                globOptData.canStoreTempObjectSyms->Clear(symId);
            }
            globOptData.maybeTempObjectSyms->Clear(symId);
        }
        else
        {
            Assert(!globOptData.canStoreTempObjectSyms);
        }

        // The symbol is being assigned to, the sym shouldn't still be in the stackLiteralInitFldDataMap
        Assert(this->IsLoopPrePass() ||
            globOptData.stackLiteralInitFldDataMap == nullptr
            || globOptData.stackLiteralInitFldDataMap->Count() == 0
            || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
    }
}